

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BottomLevelASVkImpl.cpp
# Opt level: O1

void __thiscall Diligent::BottomLevelASVkImpl::~BottomLevelASVkImpl(BottomLevelASVkImpl *this)

{
  if ((this->m_VulkanBLAS).m_VkObject != (VkAccelerationStructureKHR_T *)0x0) {
    RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
    ::
    SafeReleaseDeviceObject<VulkanUtilities::VulkanObjectWrapper<VkAccelerationStructureKHR_T*,(VulkanUtilities::VulkanHandleTypeId)21>,void>
              ((RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
                *)(this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
                  super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
                  .m_pDevice,&this->m_VulkanBLAS,
               (this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
               super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
               .m_Desc.ImmediateContextMask);
  }
  if ((this->m_VulkanBuffer).m_VkObject != (VkBuffer_T *)0x0) {
    RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
    ::
    SafeReleaseDeviceObject<VulkanUtilities::VulkanObjectWrapper<VkBuffer_T*,(VulkanUtilities::VulkanHandleTypeId)2>,void>
              ((RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
                *)(this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
                  super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
                  .m_pDevice,&this->m_VulkanBuffer,
               (this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
               super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
               .m_Desc.ImmediateContextMask);
  }
  if ((this->m_MemoryAllocation).Page != (VulkanMemoryPage *)0x0) {
    RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
    ::SafeReleaseDeviceObject<VulkanUtilities::VulkanMemoryAllocation,void>
              ((RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
                *)(this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
                  super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
                  .m_pDevice,&this->m_MemoryAllocation,
               (this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
               super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
               .m_Desc.ImmediateContextMask);
  }
  VulkanUtilities::VulkanMemoryAllocation::~VulkanMemoryAllocation(&this->m_MemoryAllocation);
  VulkanUtilities::VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2>::
  ~VulkanObjectWrapper(&this->m_VulkanBuffer);
  VulkanUtilities::
  VulkanObjectWrapper<VkAccelerationStructureKHR_T_*,_(VulkanUtilities::VulkanHandleTypeId)21>::
  ~VulkanObjectWrapper(&this->m_VulkanBLAS);
  BottomLevelASBase<Diligent::EngineVkImplTraits>::~BottomLevelASBase
            (&this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>);
  return;
}

Assistant:

BottomLevelASVkImpl::~BottomLevelASVkImpl()
{
    // Vk object can only be destroyed when it is no longer used by the GPU
    if (m_VulkanBLAS != VK_NULL_HANDLE)
        m_pDevice->SafeReleaseDeviceObject(std::move(m_VulkanBLAS), m_Desc.ImmediateContextMask);
    if (m_VulkanBuffer != VK_NULL_HANDLE)
        m_pDevice->SafeReleaseDeviceObject(std::move(m_VulkanBuffer), m_Desc.ImmediateContextMask);
    if (m_MemoryAllocation.Page != nullptr)
        m_pDevice->SafeReleaseDeviceObject(std::move(m_MemoryAllocation), m_Desc.ImmediateContextMask);
}